

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::handleEmptyClause(SaturationAlgorithm *this,Clause *cl)

{
  bool bVar1;
  RefutationFoundException *this_00;
  Clause *in_RSI;
  long in_RDI;
  Clause *in_stack_00000100;
  Splitter *in_stack_00000108;
  Clause *in_stack_ffffffffffffffc8;
  SaturationAlgorithm *in_stack_ffffffffffffffd0;
  undefined8 local_18;
  
  bVar1 = Kernel::MainLoop::isRefutation((Clause *)in_stack_ffffffffffffffd0);
  if (bVar1) {
    onNonRedundantClause(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    this_00 = (RefutationFoundException *)__cxa_allocate_exception(8);
    Kernel::MainLoop::RefutationFoundException::RefutationFoundException(this_00,in_RSI);
    __cxa_throw(this_00,&Kernel::MainLoop::RefutationFoundException::typeinfo,0);
  }
  if ((*(long *)(in_RDI + 0xd0) != 0) &&
     (bVar1 = Splitter::handleEmptyClause(in_stack_00000108,in_stack_00000100), bVar1)) {
    return;
  }
  _Unwind_Resume(local_18);
}

Assistant:

void SaturationAlgorithm::handleEmptyClause(Clause* cl)
{
  ASS(cl->isEmpty());

  if (isRefutation(cl)) {
    onNonRedundantClause(cl);

    throw RefutationFoundException(cl);
  }
  // as Clauses no longer have prop parts the only reason for an empty
  // clause not being a refutation is if it has splits

  if (_splitter && _splitter->handleEmptyClause(cl)) {
    return;
  }

  // splitter should only return false if splits isEmpty, which it cannot be
  ASSERTION_VIOLATION;
  // removed some code that dealt with the case where a clause is empty
  // but as a non-empty bdd prop part
}